

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  undefined8 *puVar5;
  long *plVar6;
  connectdata *conn;
  curl_blob *pcVar7;
  void *parg;
  ulong uVar8;
  bool bVar9;
  _Bool _Var10;
  curl_socket_t cVar11;
  int iVar12;
  CURLcode CVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  CURLcode CVar17;
  int iVar18;
  timediff_t tVar19;
  ssl_config_data *psVar20;
  long lVar21;
  char *pcVar22;
  char *pcVar23;
  SSL_CIPHER *c;
  char *pcVar24;
  char *pcVar25;
  ssl_primary_config *psVar26;
  BIO_METHOD *pBVar27;
  BIO *pBVar28;
  X509 *pXVar29;
  X509_NAME *pXVar30;
  ASN1_TIME *pAVar31;
  SSL_METHOD *meth;
  SSL_CTX *pSVar32;
  uint *puVar33;
  ulong uVar34;
  long lVar35;
  stack_st_X509 *psVar36;
  int *piVar37;
  alpn_proto_buf *buf;
  undefined8 uVar38;
  OCSP_RESPONSE *resp;
  SSL *pSVar39;
  OCSP_BASICRESP *bs;
  X509_STORE *st;
  X509 *issuer;
  X509_PUBKEY *pXVar40;
  SSL_SESSION *pubkey;
  uchar **ppuVar41;
  EVP_MD *dgst;
  OCSP_CERTID *id;
  curl_socket_t writefd;
  size_t size;
  size_t size_00;
  curl_socket_t readfd0;
  SSL_SESSION **ppSVar42;
  uint uVar43;
  CURLcode CVar44;
  int cert_status;
  int crl_reason;
  char *ptr;
  ASN1_OBJECT *paobj_cert;
  X509_ALGOR *palg_cert;
  void *ssl_sessionid;
  char group_name_final [80];
  ASN1_GENERALIZEDTIME *rev;
  int psigtype_nid;
  uchar *neg_protocol;
  curl_blob *in_stack_fffffffffffff528;
  CURLcode local_aac;
  int local_a68;
  int local_a64;
  void *local_a60;
  char *local_a58;
  ASN1_OBJECT *local_a50;
  ASN1_GENERALIZEDTIME *local_a48;
  char *local_a40;
  ssl_primary_config *local_a38;
  int *local_a30;
  SSL_SESSION *local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  SSL_SESSION *local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  ASN1_GENERALIZEDTIME *local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  alpn_proto_buf local_938;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  uchar *local_838;
  char acStack_830 [2048];
  
  piVar37 = (int *)cf->ctx;
  cVar11 = Curl_conn_cf_get_socket(cf,data);
  if (*piVar37 == 2) {
    *done = true;
    return CURLE_OK;
  }
  if (piVar37[1] != 0) goto LAB_0014b113;
  tVar19 = Curl_timeleft(data,(curltime *)0x0,true);
  if (tVar19 < 0) {
LAB_0014b3ec:
    Curl_failf(data,"SSL connection timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  pvVar4 = cf->ctx;
  local_a28 = (SSL_SESSION *)0x0;
  psVar26 = Curl_ssl_cf_get_primary_config(cf);
  psVar20 = Curl_ssl_cf_get_config(cf,data);
  bVar3 = psVar26->version;
  uVar14 = (uint)bVar3;
  pcVar22 = (psVar20->primary).clientcert;
  pcVar7 = (psVar20->primary).cert_blob;
  local_a40 = psVar20->cert_type;
  bVar2 = psVar26->field_0x69;
  plVar6 = *(long **)((long)pvVar4 + 0x30);
  CVar13 = ossl_seed(data);
  if (CVar13 != CURLE_OK) {
    return CVar13;
  }
  psVar20->certverifyresult = 1;
  local_a60 = pvVar4;
  local_a38 = psVar26;
  if (7 < uVar14) {
    Curl_failf(data,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
    return CURLE_SSL_CONNECT_ERROR;
  }
  if ((0xf3U >> (uVar14 & 0x1f) & 1) == 0) {
    if (uVar14 == 2) {
      pcVar22 = "No SSLv2 support";
    }
    else {
      pcVar22 = "No SSLv3 support";
    }
    Curl_failf(data,pcVar22);
    return CURLE_NOT_BUILT_IN;
  }
  meth = (SSL_METHOD *)TLS_client_method();
  if (*plVar6 != 0) {
    ossl_close(cf,data);
  }
  pSVar32 = SSL_CTX_new(meth);
  *plVar6 = (long)pSVar32;
  if (pSVar32 == (SSL_CTX *)0x0) {
    uVar34 = ERR_peek_error();
    pcVar22 = ossl_strerror(uVar34,(char *)&local_838,0x100);
    pcVar23 = "SSL: couldn\'t create a context: %s";
LAB_0014b816:
    Curl_failf(data,pcVar23,pcVar22);
    return CURLE_OUT_OF_MEMORY;
  }
  SSL_CTX_ctrl(pSVar32,0x21,0x10,(void *)0x0);
  if (((data->set).fdebug != (curl_debug_callback)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
    SSL_CTX_set_msg_callback((SSL_CTX *)*plVar6,ossl_trace);
    SSL_CTX_ctrl((SSL_CTX *)*plVar6,0x10,0,cf);
  }
  uVar38 = 0x82024850;
  if ((psVar20->field_0xb0 & 4) == 0) {
    uVar38 = 0x82024050;
  }
  if ((bVar3 & 0xfe) == 2) {
    return CURLE_NOT_BUILT_IN;
  }
  pSVar32 = (SSL_CTX *)*plVar6;
  psVar26 = Curl_ssl_cf_get_primary_config(cf);
  switch(psVar26->version) {
  case '\0':
    goto switchD_0014b777_caseD_0;
  case '\x01':
  case '\x04':
    lVar21 = 0x301;
    break;
  default:
    lVar21 = 0;
    break;
  case '\x05':
    lVar21 = 0x302;
    break;
  case '\x06':
    lVar21 = 0x303;
    break;
  case '\a':
    lVar21 = 0x304;
  }
  lVar21 = SSL_CTX_ctrl(pSVar32,0x7b,lVar21,(void *)0x0);
  if (lVar21 == 0) {
    return CURLE_SSL_CONNECT_ERROR;
  }
switchD_0014b777_caseD_0:
  uVar34 = (ulong)psVar26->version_max << 0x30;
  uVar8 = (ulong)(psVar26->version_max >> 0x10);
  lVar21 = (uVar34 | uVar8) + 0x2fd;
  if ((uVar34 | uVar8 & 0xffff00000000fffc) != 4) {
    lVar21 = 0;
  }
  lVar21 = SSL_CTX_ctrl(pSVar32,0x7c,lVar21,(void *)0x0);
  CVar44 = CURLE_SSL_CONNECT_ERROR;
  CVar13 = CURLE_SSL_CONNECT_ERROR;
  if (lVar21 == 0) {
    return CURLE_SSL_CONNECT_ERROR;
  }
  SSL_CTX_set_options(*plVar6,uVar38);
  pvVar4 = local_a60;
  if (*(alpn_spec **)((long)local_a60 + 0x28) == (alpn_spec *)0x0) {
LAB_0014c171:
    if ((pcVar22 != (char *)0x0 || pcVar7 != (curl_blob *)0x0) || local_a40 != (char *)0x0) {
      in_stack_fffffffffffff528 = psVar20->key_blob;
      iVar12 = cert_stuff(data,(SSL_CTX *)*plVar6,pcVar22,pcVar7,local_a40,psVar20->key,
                          in_stack_fffffffffffff528,psVar20->key_type,psVar20->key_passwd);
      if (iVar12 == 0) {
        return CURLE_SSL_CERTPROBLEM;
      }
    }
    psVar26 = local_a38;
    pcVar22 = local_a38->cipher_list;
    if (pcVar22 == (char *)0x0) {
LAB_0014c20d:
      pcVar22 = psVar26->cipher_list13;
      if (pcVar22 != (char *)0x0) {
        iVar12 = SSL_CTX_set_ciphersuites(*plVar6,pcVar22);
        if (iVar12 == 0) {
          pcVar23 = "failed setting TLS 1.3 cipher suite: %s";
          goto LAB_0014c659;
        }
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"TLS 1.3 cipher selection: %s",pcVar22);
        }
      }
      SSL_CTX_set_post_handshake_auth(*plVar6,1);
      pcVar22 = psVar26->curves;
      if ((pcVar22 == (char *)0x0) ||
         (lVar21 = SSL_CTX_ctrl((SSL_CTX *)*plVar6,0x5c,0,pcVar22), lVar21 != 0)) {
        SSL_CTX_set_verify((SSL_CTX *)*plVar6,bVar2 & 1,(callback *)0x0);
        _Var10 = Curl_tls_keylog_enabled();
        if (_Var10) {
          SSL_CTX_set_keylog_callback(*plVar6,ossl_keylog_callback);
        }
        SSL_CTX_ctrl((SSL_CTX *)*plVar6,0x2c,0x301,(void *)0x0);
        SSL_CTX_sess_set_new_cb((SSL_CTX *)*plVar6,ossl_new_session_cb);
        if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
          if (*(char *)((long)plVar6 + 0x24) == '\0') {
            CVar17 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*plVar6);
            if (CVar17 != CURLE_OK) {
              return CVar17;
            }
            *(undefined1 *)((long)plVar6 + 0x24) = 1;
          }
          Curl_set_in_callback(data,true);
          CVar17 = (*(data->set).ssl.fsslctx)(data,(void *)*plVar6,(data->set).ssl.fsslctxp);
          Curl_set_in_callback(data,false);
          if (CVar17 != CURLE_OK) {
            Curl_failf(data,"error signaled by ssl ctx callback");
            return CVar17;
          }
        }
        if ((SSL *)plVar6[1] != (SSL *)0x0) {
          SSL_free((SSL *)plVar6[1]);
        }
        pSVar39 = SSL_new((SSL_CTX *)*plVar6);
        pvVar4 = local_a60;
        plVar6[1] = (long)pSVar39;
        if (pSVar39 == (SSL *)0x0) {
          Curl_failf(data,"SSL: couldn\'t create a context (handle)");
          return CURLE_OUT_OF_MEMORY;
        }
        SSL_set_ex_data(pSVar39,0,cf);
        if ((local_a38->field_0x69 & 4) != 0) {
          SSL_ctrl((SSL *)plVar6[1],0x41,1,(void *)0x0);
        }
        SSL_set_connect_state((SSL *)plVar6[1]);
        plVar6[2] = 0;
        parg = *(void **)((long)pvVar4 + 0x18);
        if ((parg == (void *)0x0) || (lVar21 = SSL_ctrl((SSL *)plVar6[1],0x37,0,parg), lVar21 != 0))
        {
          SSL_set_ex_data((SSL *)plVar6[1],0,cf);
          pbVar1 = (byte *)((long)pvVar4 + 0x54);
          *pbVar1 = *pbVar1 & 0xfd;
          if (((psVar20->primary).field_0x69 & 8) != 0) {
            Curl_ssl_sessionid_lock(data);
            _Var10 = Curl_ssl_getsessionid(cf,data,&local_a28,(size_t *)0x0);
            if (!_Var10) {
              iVar12 = SSL_set_session((SSL *)plVar6[1],local_a28);
              if (iVar12 == 0) {
                Curl_ssl_sessionid_unlock(data);
                uVar34 = ERR_get_error();
                ppuVar41 = (uchar **)ossl_strerror(uVar34,(char *)&local_838,0x100);
                pcVar22 = "SSL: SSL_set_session failed: %s";
LAB_0014bf6e:
                Curl_failf(data,pcVar22,ppuVar41);
                return CVar44;
              }
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"SSL reusing session ID");
              }
              *(byte *)((long)local_a60 + 0x54) = *(byte *)((long)local_a60 + 0x54) | 2;
            }
            Curl_ssl_sessionid_unlock(data);
          }
          pBVar27 = (BIO_METHOD *)ossl_bio_cf_method_create();
          plVar6[3] = (long)pBVar27;
          if (pBVar27 == (BIO_METHOD *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          pBVar28 = BIO_new(pBVar27);
          if (pBVar28 == (BIO *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          BIO_set_data(pBVar28,cf);
          SSL_set_bio((SSL *)plVar6[1],pBVar28,pBVar28);
          *(undefined4 *)((long)local_a60 + 4) = 1;
LAB_0014b113:
          do {
            local_a30 = piVar37;
            piVar37 = local_a30;
            iVar12 = local_a30[1];
            if (2 < iVar12 - 1U) {
              if (iVar12 != 4) goto LAB_0014b788;
              local_a40 = (char *)cf->ctx;
              psVar26 = Curl_ssl_cf_get_primary_config(cf);
              bVar3 = psVar26->field_0x69;
              pvVar4 = cf->ctx;
              conn = cf->conn;
              psVar20 = Curl_ssl_cf_get_config(cf,data);
              psVar26 = Curl_ssl_cf_get_primary_config(cf);
              memset(&local_938,0,0x100);
              pBVar27 = BIO_s_mem();
              pBVar28 = BIO_new(pBVar27);
              if (pBVar28 != (BIO *)0x0) {
                lVar21 = *(long *)((long)pvVar4 + 0x30);
                if (((data->set).ssl.field_0xb0 & 1) != 0) {
                  Curl_ossl_certchain(data,*(SSL **)(lVar21 + 8));
                }
                pXVar29 = (X509 *)SSL_get1_peer_certificate(*(undefined8 *)(lVar21 + 8));
                *(X509 **)(lVar21 + 0x10) = pXVar29;
                if (pXVar29 == (X509 *)0x0) {
                  BIO_free(pBVar28);
                  if ((bVar3 & 3) != 0) {
                    Curl_failf(data,"SSL: couldn\'t get peer certificate");
                    return CURLE_PEER_FAILED_VERIFICATION;
                  }
                }
                else {
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    _Var10 = Curl_ssl_cf_is_proxy(cf);
                    pcVar22 = "Server";
                    if (_Var10) {
                      pcVar22 = "Proxy";
                    }
                    Curl_infof(data,"%s certificate:",pcVar22);
                    pXVar29 = *(X509 **)(lVar21 + 0x10);
                  }
                  pXVar30 = X509_get_subject_name(pXVar29);
                  iVar12 = x509_name_oneline((X509_NAME *)pXVar30,(char *)&local_838,size);
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    ppuVar41 = (uchar **)"[NONE]";
                    if (iVar12 == 0) {
                      ppuVar41 = &local_838;
                    }
                    Curl_infof(data," subject: %s",ppuVar41);
                  }
                  pAVar31 = (ASN1_TIME *)X509_get0_notBefore(*(undefined8 *)(lVar21 + 0x10));
                  ASN1_TIME_print(pBVar28,pAVar31);
                  uVar34 = BIO_ctrl(pBVar28,3,0,&local_a58);
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    Curl_infof(data," start date: %.*s",uVar34 & 0xffffffff);
                  }
                  BIO_ctrl(pBVar28,1,0,(void *)0x0);
                  pAVar31 = (ASN1_TIME *)X509_get0_notAfter(*(undefined8 *)(lVar21 + 0x10));
                  ASN1_TIME_print(pBVar28,pAVar31);
                  uVar34 = BIO_ctrl(pBVar28,3,0,&local_a58);
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    Curl_infof(data," expire date: %.*s",uVar34 & 0xffffffff);
                  }
                  BIO_ctrl(pBVar28,1,0,(void *)0x0);
                  BIO_free(pBVar28);
                  if (((psVar26->field_0x69 & 2) != 0) &&
                     (CVar13 = Curl_ossl_verifyhost
                                         (data,conn,(ssl_peer *)((long)pvVar4 + 8),
                                          *(X509 **)(lVar21 + 0x10)), CVar13 != CURLE_OK)) {
                    X509_free(*(X509 **)(lVar21 + 0x10));
                    *(undefined8 *)(lVar21 + 0x10) = 0;
                    return CVar13;
                  }
                  pXVar30 = X509_get_issuer_name(*(X509 **)(lVar21 + 0x10));
                  iVar12 = x509_name_oneline((X509_NAME *)pXVar30,(char *)&local_838,size_00);
                  if (iVar12 == 0) {
                    if (((data->set).field_0x8bd & 0x10) != 0) {
                      Curl_infof(data," issuer: %s",&local_838);
                    }
                    pcVar7 = psVar26->issuercert_blob;
                    if (psVar26->issuercert != (char *)0x0) {
                      if (pcVar7 != (curl_blob *)0x0) goto LAB_0014be98;
                      pBVar27 = BIO_s_file();
                      pBVar28 = BIO_new(pBVar27);
                      if (pBVar28 == (BIO *)0x0) {
                        uVar34 = ERR_get_error();
                        pcVar22 = ossl_strerror(uVar34,(char *)&local_938,0x100);
                        pcVar23 = "BIO_new return NULL, OpenSSL error %s";
                        goto LAB_0014c535;
                      }
                      lVar35 = BIO_ctrl(pBVar28,0x6c,3,psVar26->issuercert);
                      if ((int)lVar35 < 1) {
                        if ((bVar3 & 3) != 0) {
                          Curl_failf(data,"SSL: Unable to open issuer cert (%s)",psVar26->issuercert
                                    );
                        }
                        BIO_free(pBVar28);
                        goto LAB_0014bfd0;
                      }
LAB_0014beaf:
                      pXVar29 = PEM_read_bio_X509(pBVar28,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0
                                                 );
                      if (pXVar29 == (X509 *)0x0) {
                        if ((bVar3 & 3) != 0) {
                          Curl_failf(data,"SSL: Unable to read issuer cert (%s)",psVar26->issuercert
                                    );
                        }
                        BIO_free(pBVar28);
                        pXVar29 = (X509 *)0x0;
                      }
                      else {
                        iVar12 = X509_check_issued(pXVar29,*(X509 **)(lVar21 + 0x10));
                        if (iVar12 == 0) {
                          if (((data->set).field_0x8bd & 0x10) != 0) {
                            Curl_infof(data," SSL certificate issuer check ok (%s)",
                                       psVar26->issuercert);
                          }
                          BIO_free(pBVar28);
                          X509_free(pXVar29);
                          goto LAB_0014c02b;
                        }
                        if ((bVar3 & 3) != 0) {
                          Curl_failf(data,"SSL: Certificate issuer check failed (%s)",
                                     psVar26->issuercert);
                        }
                        BIO_free(pBVar28);
                      }
                      X509_free(pXVar29);
LAB_0014bfd0:
                      X509_free(*(X509 **)(lVar21 + 0x10));
                      *(undefined8 *)(lVar21 + 0x10) = 0;
                      return CURLE_SSL_ISSUER_ERROR;
                    }
                    if (pcVar7 != (curl_blob *)0x0) {
LAB_0014be98:
                      pBVar28 = BIO_new_mem_buf(pcVar7->data,(int)pcVar7->len);
                      if (pBVar28 == (BIO *)0x0) {
                        uVar34 = ERR_get_error();
                        pcVar22 = ossl_strerror(uVar34,(char *)&local_938,0x100);
                        pcVar23 = "BIO_new_mem_buf NULL, OpenSSL error %s";
LAB_0014c535:
                        Curl_failf(data,pcVar23,pcVar22);
                        X509_free(*(X509 **)(lVar21 + 0x10));
                        *(undefined8 *)(lVar21 + 0x10) = 0;
                        return CURLE_OUT_OF_MEMORY;
                      }
                      goto LAB_0014beaf;
                    }
LAB_0014c02b:
                    lVar35 = SSL_get_verify_result(*(SSL **)(lVar21 + 8));
                    psVar20->certverifyresult = lVar35;
                    if (lVar35 == 0) {
                      if (((data->set).field_0x8bd & 0x10) == 0) {
LAB_0014c507:
                        local_aac = CURLE_OK;
                      }
                      else {
                        local_aac = CURLE_OK;
                        Curl_infof(data," SSL certificate verify ok.");
                      }
                    }
                    else if ((psVar26->field_0x69 & 1) == 0) {
                      if (((data->set).field_0x8bd & 0x10) == 0) goto LAB_0014c507;
                      pcVar22 = X509_verify_cert_error_string(lVar35);
                      local_aac = CURLE_OK;
                      Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway."
                                 ,pcVar22,lVar35);
                    }
                    else {
                      local_aac = CURLE_PEER_FAILED_VERIFICATION;
                      if ((bVar3 & 3) != 0) {
                        pcVar22 = X509_verify_cert_error_string(lVar35);
                        Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar22,lVar35);
                      }
                    }
                  }
                  else {
                    local_aac = CURLE_PEER_FAILED_VERIFICATION;
                    if ((bVar3 & 3) != 0) {
                      Curl_failf(data,"SSL: couldn\'t get X509-issuer name");
                    }
                  }
                  pSVar39 = *(SSL **)(lVar21 + 8);
                  lVar35 = SSL_get_verify_result(pSVar39);
                  if (lVar35 == 0) {
                    psVar36 = (stack_st_X509 *)SSL_get0_verified_chain();
                  }
                  else {
                    psVar36 = SSL_get_peer_cert_chain(pSVar39);
                  }
                  uVar14 = OPENSSL_sk_num(psVar36);
                  if (0 < (int)uVar14) {
                    uVar34 = 0;
                    do {
                      local_9e8 = 0;
                      uStack_9e0 = 0;
                      local_9f8 = 0;
                      uStack_9f0 = 0;
                      local_a08 = 0;
                      uStack_a00 = 0;
                      local_a18 = 0;
                      uStack_a10 = 0;
                      local_a28 = (SSL_SESSION *)0x0;
                      uStack_a20 = 0;
                      local_998 = 0;
                      uStack_990 = 0;
                      local_9a8 = 0;
                      uStack_9a0 = 0;
                      local_9b8 = 0;
                      uStack_9b0 = 0;
                      local_9c8 = 0;
                      uStack_9c0 = 0;
                      local_9d8 = (SSL_SESSION *)0x0;
                      uStack_9d0 = 0;
                      local_a48 = (ASN1_GENERALIZEDTIME *)0x0;
                      local_a50 = (ASN1_OBJECT *)0x0;
                      uVar38 = OPENSSL_sk_value(psVar36,uVar34);
                      X509_get0_signature(0,&local_a48,uVar38);
                      X509_ALGOR_get0(&local_a50,(int *)0x0,(void **)0x0,(X509_ALGOR *)local_a48);
                      OBJ_obj2txt((char *)&local_a28,0x50,local_a50,0);
                      uVar38 = X509_get0_pubkey(uVar38);
                      uVar15 = EVP_PKEY_get_bits(uVar38);
                      uVar16 = EVP_PKEY_get_security_bits(uVar38);
                      local_948 = 0;
                      uStack_940 = 0;
                      local_958 = 0;
                      uStack_950 = 0;
                      local_968 = 0;
                      uStack_960 = 0;
                      local_978 = 0;
                      uStack_970 = 0;
                      local_988 = (ASN1_GENERALIZEDTIME *)0x0;
                      uStack_980 = 0;
                      iVar12 = EVP_PKEY_get_group_name(uVar38,&local_988,0x50,0);
                      curl_msnprintf((char *)&local_9d8,0x50,"/%s",&local_988);
                      pcVar22 = (char *)EVP_PKEY_get0_type_name(uVar38);
                      if (((data->set).field_0x8bd & 0x10) != 0) {
                        if (pcVar22 == (char *)0x0) {
                          pcVar22 = "?";
                        }
                        ppSVar42 = &local_9d8;
                        if (iVar12 == 0) {
                          ppSVar42 = (SSL_SESSION **)0x172bcd;
                        }
                        in_stack_fffffffffffff528 =
                             (curl_blob *)
                             CONCAT44((int)((ulong)in_stack_fffffffffffff528 >> 0x20),uVar16);
                        Curl_infof(data,
                                   "  Certificate level %d: Public key type %s%s (%d/%d Bits/secBits), signed using %s"
                                   ,uVar34,pcVar22,ppSVar42,uVar15,in_stack_fffffffffffff528,
                                   &local_a28);
                      }
                      uVar43 = (int)uVar34 + 1;
                      uVar34 = (ulong)uVar43;
                    } while (uVar14 != uVar43);
                  }
                  if (((psVar26->field_0x69 & 4) == 0) ||
                     ((*(byte *)((long)pvVar4 + 0x54) & 2) != 0)) {
LAB_0014c72d:
                    CVar13 = CURLE_OK;
                    if ((bVar3 & 3) != 0) {
                      CVar13 = local_aac;
                    }
                    _Var10 = Curl_ssl_cf_is_proxy(cf);
                    pcVar22 = (data->set).str[(ulong)_Var10 + 0x1e];
                    local_a58 = pcVar22;
                    if (pcVar22 != (char *)0x0 && CVar13 == CURLE_OK) {
                      lVar35 = *(long *)(lVar21 + 0x10);
                      if (lVar35 == 0) {
LAB_0014c83e:
                        CVar13 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                      }
                      else {
                        pXVar40 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar35);
                        uVar14 = i2d_X509_PUBKEY(pXVar40,(uchar **)0x0);
                        if ((int)uVar14 < 1) goto LAB_0014c83e;
                        uVar34 = (ulong)uVar14;
                        pubkey = (SSL_SESSION *)(*Curl_cmalloc)(uVar34);
                        local_a28 = pubkey;
                        if (pubkey == (SSL_SESSION *)0x0) goto LAB_0014c83e;
                        pXVar40 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar35);
                        uVar43 = i2d_X509_PUBKEY(pXVar40,(uchar **)&local_a28);
                        if (((long)local_a28 - (long)pubkey != uVar34 || uVar14 != uVar43) ||
                            local_a28 == (SSL_SESSION *)0x0) {
                          (*Curl_cfree)(pubkey);
                          goto LAB_0014c83e;
                        }
                        CVar13 = Curl_pin_peer_pubkey(data,pcVar22,(uchar *)pubkey,uVar34);
                        (*Curl_cfree)(pubkey);
                        if (CVar13 == CURLE_OK) {
                          CVar13 = CURLE_OK;
                          goto LAB_0014c864;
                        }
                      }
                      Curl_failf(data,"SSL: public key does not match pinned public key");
                    }
LAB_0014c864:
                    X509_free(*(X509 **)(lVar21 + 0x10));
                    *(undefined8 *)(lVar21 + 0x10) = 0;
                    *(undefined4 *)((long)pvVar4 + 4) = 5;
                  }
                  else {
                    puVar5 = *(undefined8 **)((long)cf->ctx + 0x30);
                    lVar35 = SSL_ctrl((SSL *)puVar5[1],0x46,0,&local_a28);
                    if (local_a28 == (SSL_SESSION *)0x0) {
                      pcVar22 = "No OCSP response received";
LAB_0014c098:
                      resp = (OCSP_RESPONSE *)0x0;
LAB_0014c09b:
                      Curl_failf(data,pcVar22);
LAB_0014c0a5:
                      OCSP_RESPONSE_free(resp);
                      CVar13 = CURLE_SSL_INVALIDCERTSTATUS;
                    }
                    else {
                      local_9d8 = local_a28;
                      resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&local_9d8,lVar35);
                      if (resp == (OCSP_RESPONSE *)0x0) {
                        pcVar22 = "Invalid OCSP response";
                        goto LAB_0014c098;
                      }
                      iVar12 = OCSP_response_status(resp);
                      if (iVar12 != 0) {
                        pcVar22 = OCSP_response_status_str((long)iVar12);
                        Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar22);
                        goto LAB_0014c0a5;
                      }
                      bs = OCSP_response_get1_basic(resp);
                      if (bs == (OCSP_BASICRESP *)0x0) {
                        pcVar22 = "Invalid OCSP response";
                        goto LAB_0014c09b;
                      }
                      psVar36 = SSL_get_peer_cert_chain((SSL *)puVar5[1]);
                      if (psVar36 == (stack_st_X509 *)0x0) {
                        bVar9 = false;
                        Curl_failf(data,"Could not get peer certificate chain");
                        CVar13 = CURLE_SSL_INVALIDCERTSTATUS;
                        goto LAB_0014c706;
                      }
                      st = SSL_CTX_get_cert_store((SSL_CTX *)*puVar5);
                      iVar12 = OCSP_basic_verify(bs,psVar36,st,0);
                      if (iVar12 < 1) {
                        pcVar22 = "OCSP response verification failed";
LAB_0014c6ea:
                        Curl_failf(data,pcVar22);
LAB_0014c6fb:
                        bVar9 = false;
                        CVar13 = CURLE_SSL_INVALIDCERTSTATUS;
                      }
                      else {
                        pXVar29 = (X509 *)SSL_get1_peer_certificate(puVar5[1]);
                        if (pXVar29 == (X509 *)0x0) {
                          pcVar22 = "Error getting peer certificate";
                          goto LAB_0014c6ea;
                        }
                        iVar12 = OPENSSL_sk_num(psVar36);
                        if (iVar12 < 1) {
LAB_0014c63e:
                          X509_free(pXVar29);
LAB_0014c646:
                          pcVar22 = "Error computing OCSP ID";
                          goto LAB_0014c6ea;
                        }
                        iVar12 = 0;
                        while( true ) {
                          issuer = (X509 *)OPENSSL_sk_value(psVar36,iVar12);
                          iVar18 = X509_check_issued(issuer,pXVar29);
                          if (iVar18 == 0) break;
                          iVar12 = iVar12 + 1;
                          iVar18 = OPENSSL_sk_num(psVar36);
                          if (iVar18 <= iVar12) goto LAB_0014c63e;
                        }
                        dgst = EVP_sha1();
                        id = OCSP_cert_to_id(dgst,pXVar29,issuer);
                        X509_free(pXVar29);
                        if (id == (OCSP_CERTID *)0x0) goto LAB_0014c646;
                        iVar12 = OCSP_resp_find_status
                                           (bs,id,&local_a68,&local_a64,&local_988,&local_a48,
                                            (ASN1_GENERALIZEDTIME **)&local_a50);
                        OCSP_CERTID_free(id);
                        if (iVar12 != 1) {
                          pcVar22 = "Could not find certificate ID in OCSP response";
                          goto LAB_0014c6ea;
                        }
                        iVar12 = OCSP_check_validity(local_a48,(ASN1_GENERALIZEDTIME *)local_a50,300
                                                     ,-1);
                        if (iVar12 == 0) {
                          pcVar22 = "OCSP response has expired";
                          goto LAB_0014c6ea;
                        }
                        if (((data->set).field_0x8bd & 0x10) != 0) {
                          pcVar22 = OCSP_cert_status_str((long)local_a68);
                          Curl_infof(data,"SSL certificate status: %s (%d)",pcVar22);
                        }
                        if (local_a68 != 0) {
                          if (local_a68 != 1) {
                            CVar13 = CURLE_SSL_INVALIDCERTSTATUS;
                            bVar9 = false;
                            goto LAB_0014c706;
                          }
                          pcVar22 = OCSP_crl_reason_str((long)local_a64);
                          Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar22);
                          goto LAB_0014c6fb;
                        }
                        bVar9 = true;
                        CVar13 = CURLE_OK;
                      }
LAB_0014c706:
                      OCSP_BASICRESP_free(bs);
                      OCSP_RESPONSE_free(resp);
                      local_aac = CURLE_OK;
                      if (bVar9) goto LAB_0014c72d;
                    }
                    _Var10 = Curl_ssl_cf_is_proxy(cf);
                    if (!_Var10) {
                      local_a28 = (SSL_SESSION *)0x0;
                      Curl_ssl_sessionid_lock(data);
                      _Var10 = Curl_ssl_getsessionid(cf,data,&local_a28,(size_t *)0x0);
                      if (!_Var10) {
                        if (((data->set).field_0x8bd & 0x10) != 0) {
                          Curl_infof(data,"Remove session ID again from cache");
                        }
                        Curl_ssl_delsessionid(data,local_a28);
                      }
                      Curl_ssl_sessionid_unlock(data);
                    }
                    X509_free(*(X509 **)(lVar21 + 0x10));
                    *(undefined8 *)(lVar21 + 0x10) = 0;
                  }
                  piVar37 = local_a30;
                  if (CVar13 != CURLE_OK) {
                    return CVar13;
                  }
                }
                local_a40[4] = '\x05';
                local_a40[5] = '\0';
                local_a40[6] = '\0';
                local_a40[7] = '\0';
                iVar12 = piVar37[1];
                local_a30 = piVar37;
LAB_0014b788:
                if (iVar12 == 5) {
                  *local_a30 = 2;
                }
                *done = iVar12 == 5;
                local_a30[1] = 0;
                return CURLE_OK;
              }
              uVar34 = ERR_get_error();
              pcVar22 = ossl_strerror(uVar34,(char *)&local_938,0x100);
              pcVar23 = "BIO_new return NULL, OpenSSL error %s";
              goto LAB_0014b816;
            }
            tVar19 = Curl_timeleft(data,(curltime *)0x0,true);
            if (tVar19 < 0) goto LAB_0014b3ec;
            if ((!nonblocking) && (uVar14 = piVar37[1], (uVar14 & 0xfffffffe) == 2)) {
              writefd = -1;
              if (uVar14 == 3) {
                writefd = cVar11;
              }
              readfd0 = -1;
              if (uVar14 == 2) {
                readfd0 = cVar11;
              }
              iVar12 = Curl_socket_check(readfd0,-1,writefd,tVar19);
              if (iVar12 < 0) {
                puVar33 = (uint *)__errno_location();
                Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar33);
                return CURLE_SSL_CONNECT_ERROR;
              }
              if (iVar12 == 0) goto LAB_0014b3ec;
            }
            pvVar4 = cf->ctx;
            puVar5 = *(undefined8 **)((long)pvVar4 + 0x30);
            psVar20 = Curl_ssl_cf_get_config(cf,data);
            ERR_clear_error();
            iVar12 = SSL_connect((SSL *)puVar5[1]);
            if (*(char *)((long)puVar5 + 0x24) == '\0') {
              CVar13 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar5);
              if (CVar13 != CURLE_OK) {
                return CVar13;
              }
              *(undefined1 *)((long)puVar5 + 0x24) = 1;
            }
            if (iVar12 == 1) {
              local_938.data._0_8_ = local_938.data._0_8_ & 0xffffffff00000000;
              *(undefined4 *)((long)pvVar4 + 4) = 4;
              SSL_get_peer_signature_type_nid(puVar5[1],&local_938);
              lVar21 = SSL_ctrl((SSL *)puVar5[1],0x86,0,(void *)0x0);
              pcVar22 = OBJ_nid2sn((uint)lVar21 & 0xffff);
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                pcVar23 = SSL_get_version((SSL *)puVar5[1]);
                c = SSL_get_current_cipher((SSL *)puVar5[1]);
                pcVar24 = SSL_CIPHER_get_name(c);
                if (pcVar22 == (char *)0x0) {
                  pcVar22 = "[blank]";
                }
                pcVar25 = OBJ_nid2sn(local_938.data._0_4_);
                Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar23,pcVar24,pcVar22,
                           pcVar25);
              }
              if (*(long *)((long)pvVar4 + 0x28) != 0) {
                SSL_get0_alpn_selected(puVar5[1],&local_838,&local_a28);
                CVar13 = Curl_alpn_set_negotiated(cf,data,local_838,(ulong)local_a28 & 0xffffffff);
                if (CVar13 != CURLE_OK) {
                  return CVar13;
                }
              }
            }
            else {
              iVar12 = SSL_get_error((SSL *)puVar5[1],iVar12);
              if (iVar12 < 9) {
                if (iVar12 == 2) {
                  *(undefined4 *)((long)pvVar4 + 4) = 2;
                }
                else {
                  if (iVar12 != 3) goto LAB_0014b312;
                  *(undefined4 *)((long)pvVar4 + 4) = 3;
                }
              }
              else if ((iVar12 == 9) || (iVar12 == 0xc)) {
                *(undefined4 *)((long)pvVar4 + 4) = 1;
              }
              else {
LAB_0014b312:
                if (*(int *)(puVar5 + 4) != 0x51) {
                  memset(&local_838,0,0x100);
                  *(undefined4 *)((long)pvVar4 + 4) = 1;
                  uVar34 = ERR_get_error();
                  uVar14 = (uint)uVar34;
                  if ((uVar14 & 0xff800000) == 0xa000000 && -1 < (int)uVar14) {
                    uVar14 = uVar14 & 0x7fffff;
                    if (uVar14 != 0x86) {
                      if (uVar14 == 0x45c) {
                        ossl_strerror(uVar34,(char *)&local_838,0x100);
                        CVar44 = CURLE_SSL_CLIENTCERT;
                        goto LAB_0014bf5a;
                      }
                      if (uVar14 != 0x415) goto LAB_0014b97b;
                    }
                    lVar21 = SSL_get_verify_result((SSL *)puVar5[1]);
                    if (lVar21 == 0) {
                      builtin_strncpy(acStack_830,"ificate verification failed",0x1c);
                      local_838 = (uchar *)0x74726563204c5353;
                    }
                    else {
                      psVar20->certverifyresult = lVar21;
                      pcVar22 = X509_verify_cert_error_string(lVar21);
                      curl_msnprintf((char *)&local_838,0x100,"SSL certificate problem: %s",pcVar22)
                      ;
                    }
                    CVar44 = CURLE_PEER_FAILED_VERIFICATION;
                  }
                  else {
LAB_0014b97b:
                    ossl_strerror(uVar34,(char *)&local_838,0x100);
                    CVar44 = CURLE_SSL_CONNECT_ERROR;
                    if (uVar34 == 0) {
                      local_8f8 = 0;
                      uStack_8f0 = 0;
                      local_908 = 0;
                      uStack_900 = 0;
                      local_938.data[0x20] = '\0';
                      local_938._33_3_ = 0;
                      local_938.len = 0;
                      uStack_910 = 0;
                      local_938.data[0x10] = '\0';
                      local_938.data[0x11] = '\0';
                      local_938.data[0x12] = '\0';
                      local_938.data[0x13] = '\0';
                      local_938.data[0x14] = '\0';
                      local_938.data[0x15] = '\0';
                      local_938.data[0x16] = '\0';
                      local_938.data[0x17] = '\0';
                      local_938.data[0x18] = '\0';
                      local_938.data[0x19] = '\0';
                      local_938.data[0x1a] = '\0';
                      local_938.data[0x1b] = '\0';
                      local_938.data[0x1c] = '\0';
                      local_938.data[0x1d] = '\0';
                      local_938.data[0x1e] = '\0';
                      local_938.data[0x1f] = '\0';
                      local_938.data[0] = '\0';
                      local_938.data[1] = '\0';
                      local_938.data[2] = '\0';
                      local_938.data[3] = '\0';
                      local_938.data[4] = '\0';
                      local_938.data[5] = '\0';
                      local_938.data[6] = '\0';
                      local_938.data[7] = '\0';
                      local_938.data[8] = '\0';
                      local_938.data[9] = '\0';
                      local_938.data[10] = '\0';
                      local_938.data[0xb] = '\0';
                      local_938.data[0xc] = '\0';
                      local_938.data[0xd] = '\0';
                      local_938.data[0xe] = '\0';
                      local_938.data[0xf] = '\0';
                      piVar37 = __errno_location();
                      buf = &local_938;
                      if (iVar12 == 5 && *piVar37 != 0) {
                        Curl_strerror(*piVar37,(char *)buf,0x50);
                        if (local_938.data[0] != '\0') goto LAB_0014ba10;
                      }
                      buf = (alpn_proto_buf *)SSL_ERROR_to_str(iVar12);
LAB_0014ba10:
                      Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",buf,
                                 *(undefined8 *)((long)pvVar4 + 8),
                                 (ulong)*(uint *)((long)pvVar4 + 0x50));
                      return CURLE_SSL_CONNECT_ERROR;
                    }
                  }
LAB_0014bf5a:
                  pcVar22 = "%s";
                  ppuVar41 = &local_838;
                  goto LAB_0014bf6e;
                }
              }
            }
            piVar37 = local_a30;
            if ((nonblocking) && (local_a30[1] - 1U < 3)) {
              return CURLE_OK;
            }
          } while( true );
        }
        pcVar22 = "Failed set SNI";
        goto LAB_0014be80;
      }
      pcVar23 = "failed setting curves list: \'%s\'";
    }
    else {
      iVar12 = SSL_CTX_set_cipher_list((SSL_CTX *)*plVar6,pcVar22);
      if (iVar12 != 0) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"Cipher selection: %s",pcVar22);
        }
        goto LAB_0014c20d;
      }
      pcVar23 = "failed setting cipher list: %s";
    }
LAB_0014c659:
    Curl_failf(data,pcVar23,pcVar22);
    CVar13 = CURLE_SSL_CIPHER;
  }
  else {
    CVar17 = Curl_alpn_to_proto_buf(&local_938,*(alpn_spec **)((long)local_a60 + 0x28));
    if ((CVar17 == CURLE_OK) &&
       (iVar12 = SSL_CTX_set_alpn_protos(*plVar6,&local_938,local_938.len), iVar12 == 0)) {
      Curl_alpn_to_proto_str(&local_938,*(alpn_spec **)((long)pvVar4 + 0x28));
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"ALPN: curl offers %s",&local_938);
      }
      goto LAB_0014c171;
    }
    pcVar22 = "Error setting ALPN";
LAB_0014be80:
    Curl_failf(data,pcVar22);
  }
  return CVar13;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it's available. */
    if(!nonblocking &&
       (connssl->connecting_state == ssl_connect_2_reading ||
        connssl->connecting_state == ssl_connect_2_writing)) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}